

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigenval.c
# Opt level: O0

double GetMinEigenval(QMatrix *A,PrecondProcType PrecondProc,double OmegaPrecond)

{
  LASErrIdType LVar1;
  void **ppvVar2;
  char *Object1Name;
  undefined8 *local_30;
  EigenvalInfoType *EigenvalInfo;
  double MinEigenval;
  double OmegaPrecond_local;
  PrecondProcType PrecondProc_local;
  QMatrix *A_local;
  
  Q_Lock(A);
  LVar1 = LASResult();
  if (LVar1 == LASOK) {
    ppvVar2 = Q_EigenvalInfo(A);
    local_30 = (undefined8 *)*ppvVar2;
    if (local_30 == (undefined8 *)0x0) {
      local_30 = (undefined8 *)malloc(0x20);
      if (local_30 == (undefined8 *)0x0) {
        Object1Name = Q_GetName(A);
        LASError(LASMemAllocErr,"GetMinEigenval",Object1Name,(char *)0x0,(char *)0x0);
      }
      else {
        ppvVar2 = Q_EigenvalInfo(A);
        *ppvVar2 = local_30;
        EstimEigenvals(A,PrecondProc,OmegaPrecond);
      }
    }
    if ((((PrecondProcType)local_30[2] != PrecondProc) || ((double)local_30[3] != OmegaPrecond)) ||
       (NAN((double)local_30[3]) || NAN(OmegaPrecond))) {
      EstimEigenvals(A,PrecondProc,OmegaPrecond);
    }
    LVar1 = LASResult();
    if (LVar1 == LASOK) {
      EigenvalInfo = (EigenvalInfoType *)*local_30;
    }
    else {
      EigenvalInfo = (EigenvalInfoType *)0x3ff0000000000000;
    }
  }
  else {
    EigenvalInfo = (EigenvalInfoType *)0x3ff0000000000000;
  }
  return (double)EigenvalInfo;
}

Assistant:

double GetMinEigenval(QMatrix *A, PrecondProcType PrecondProc, double OmegaPrecond)
/* returns estimate for minimum eigenvalue of the matrix A */
{
    double MinEigenval;
    
    EigenvalInfoType *EigenvalInfo;
    
    Q_Lock(A);
    
    if (LASResult() == LASOK) {
        EigenvalInfo = (EigenvalInfoType *)*(Q_EigenvalInfo(A));
        /* if eigenvalues not estimated yet, ... */
        if (EigenvalInfo == NULL) {
            EigenvalInfo = (EigenvalInfoType *)malloc(sizeof(EigenvalInfoType));
            if (EigenvalInfo != NULL) {
	        *(Q_EigenvalInfo(A)) = (void *)EigenvalInfo;
                EstimEigenvals(A, PrecondProc, OmegaPrecond);
            } else {
                LASError(LASMemAllocErr, "GetMinEigenval", Q_GetName(A), NULL, NULL);
            }
        }
	
        /* if eigenvalues estimated with an other preconditioner, ... */
        if (EigenvalInfo->PrecondProcUsed != PrecondProc
	    || EigenvalInfo->OmegaPrecondUsed != OmegaPrecond) {
            EstimEigenvals(A, PrecondProc, OmegaPrecond);
        }

        if (LASResult() == LASOK)
            MinEigenval = EigenvalInfo->MinEigenval;
        else 
            MinEigenval = 1.0;
    } else {
        MinEigenval = 1.0;
    }
    
    return(MinEigenval);             
}